

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Deserializer.cpp
# Opt level: O1

void __thiscall
adios2::format::BP4Deserializer::ParseMetadataIndex
          (BP4Deserializer *this,BufferSTL *bufferSTL,size_t absoluteStartPos,bool hasHeader,
          bool oneStepOnly)

{
  size_t *psVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  pointer pcVar5;
  size_t sVar6;
  long lVar7;
  bool bVar8;
  long *plVar9;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  mapped_type *this_01;
  undefined7 in_register_00000009;
  long *plVar10;
  size_type *psVar11;
  uint __val;
  undefined7 in_register_00000081;
  uint __len;
  uint uVar12;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ptrs;
  uint64_t currentTimeStamp;
  uint64_t mpiRank;
  uint64_t currentStep;
  string __str;
  string local_108;
  string local_e0;
  BP4Deserializer *local_c0;
  undefined4 local_b4;
  string local_b0;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_b4 = (undefined4)CONCAT71(in_register_00000081,oneStepOnly);
  local_c0 = this;
  if ((int)CONCAT71(in_register_00000009,hasHeader) != 0) {
    (bufferSTL->super_Buffer).m_Position = 0;
    std::__cxx11::string::_M_replace
              ((ulong)&this->m_Minifooter,0,(char *)(this->m_Minifooter).VersionTag._M_string_length
               ,(ulong)(bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl
                       .super__Vector_impl_data._M_start);
    (bufferSTL->super_Buffer).m_Position = 0x24;
    cVar2 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[0x24];
    (bufferSTL->super_Buffer).m_Position = 0x25;
    (this->m_Minifooter).IsLittleEndian = cVar2 == '\0';
    bVar8 = helper::IsLittleEndian();
    if ((this->m_Minifooter).IsLittleEndian != bVar8) {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Toolkit","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"format::bp::BP4Deserializer","");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"ParseMetadataIndex","");
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,
                 "reader found BigEndian bp file, this version of ADIOS2 wasn\'t compiled with the cmake flag -DADIOS2_USE_Endian_Reverse=ON explicitly, in call to Open"
                 ,"");
      helper::Throw<std::runtime_error>(&local_108,&local_90,&local_b0,&local_e0,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      this = local_c0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
    }
    (this->m_Minifooter).HasSubFiles = true;
    (bufferSTL->super_Buffer).m_Position = 0x20;
    pcVar5 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    cVar2 = pcVar5[0x20];
    (bufferSTL->super_Buffer).m_Position = 0x21;
    (this->m_Minifooter).ADIOSVersionMajor = cVar2 - 0x30U;
    (bufferSTL->super_Buffer).m_Position = 0x21;
    cVar3 = pcVar5[0x21];
    (bufferSTL->super_Buffer).m_Position = 0x22;
    (this->m_Minifooter).ADIOSVersionMinor = cVar3 - 0x30U;
    (bufferSTL->super_Buffer).m_Position = 0x22;
    cVar4 = pcVar5[0x22];
    (bufferSTL->super_Buffer).m_Position = 0x23;
    (this->m_Minifooter).ADIOSVersionPatch = cVar4 - 0x30U;
    (this->m_Minifooter).ADIOSVersion =
         (uint)(byte)(cVar4 - 0x30U) +
         (uint)(byte)(cVar3 - 0x30U) * 1000 + (uint)(byte)(cVar2 - 0x30U) * 1000000;
    (bufferSTL->super_Buffer).m_Position = 0x25;
    cVar2 = pcVar5[0x25];
    (bufferSTL->super_Buffer).m_Position = 0x26;
    (this->m_Minifooter).Version = cVar2;
    if (cVar2 != '\x04') {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Toolkit","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"format::bp::BP4Deserializer","");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"ParseMetadataIndex","");
      cVar2 = (this->m_Minifooter).Version;
      uVar12 = (uint)cVar2;
      __val = -uVar12;
      if (0 < (int)uVar12) {
        __val = uVar12;
      }
      __len = 1;
      if (9 < __val) {
        __len = 3 - (__val < 100);
      }
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (cVar2 >> 7));
      std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + (uVar12 >> 0x1f),__len,__val);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x75b2fb);
      plVar10 = plVar9 + 2;
      if ((long *)*plVar9 == plVar10) {
        local_60 = *plVar10;
        lStack_58 = plVar9[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar10;
        local_70 = (long *)*plVar9;
      }
      local_68 = plVar9[1];
      *plVar9 = (long)plVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_e0.field_2._M_allocated_capacity = *psVar11;
        local_e0.field_2._8_8_ = plVar9[3];
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      }
      else {
        local_e0.field_2._M_allocated_capacity = *psVar11;
        local_e0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_e0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      helper::Throw<std::runtime_error>(&local_108,&local_90,&local_b0,&local_e0,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      this = local_c0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
    }
    (bufferSTL->super_Buffer).m_Position = 0x26;
    cVar2 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[0x26];
    (bufferSTL->super_Buffer).m_Position = 0x27;
    this->m_WriterIsActive = cVar2 == '\x01';
    (bufferSTL->super_Buffer).m_Position = 0x40;
  }
  do {
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    sVar6 = (bufferSTL->super_Buffer).m_Position;
    pcVar5 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_90._M_dataplus._M_p = *(pointer *)(pcVar5 + sVar6);
    (bufferSTL->super_Buffer).m_Position = sVar6 + 8;
    local_b0._M_dataplus._M_p = *(pointer *)(pcVar5 + sVar6 + 8);
    (bufferSTL->super_Buffer).m_Position = sVar6 + 0x10;
    lVar7 = *(long *)(pcVar5 + sVar6 + 0x10);
    (bufferSTL->super_Buffer).m_Position = sVar6 + 0x18;
    local_e0._M_dataplus._M_p = (pointer)(lVar7 - absoluteStartPos);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108,(iterator)0x0,
               (unsigned_long *)&local_e0);
    sVar6 = (bufferSTL->super_Buffer).m_Position;
    lVar7 = *(long *)((bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start + sVar6);
    (bufferSTL->super_Buffer).m_Position = sVar6 + 8;
    local_e0._M_dataplus._M_p = (pointer)(lVar7 - absoluteStartPos);
    if (local_108._M_string_length == local_108.field_2._M_allocated_capacity) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108,
                 (iterator)local_108._M_string_length,(unsigned_long *)&local_e0);
    }
    else {
      *(pointer *)local_108._M_string_length = local_e0._M_dataplus._M_p;
      local_108._M_string_length = local_108._M_string_length + 8;
    }
    sVar6 = (bufferSTL->super_Buffer).m_Position;
    lVar7 = *(long *)((bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start + sVar6);
    (bufferSTL->super_Buffer).m_Position = sVar6 + 8;
    local_e0._M_dataplus._M_p = (pointer)(lVar7 - absoluteStartPos);
    if (local_108._M_string_length == local_108.field_2._M_allocated_capacity) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108,
                 (iterator)local_108._M_string_length,(unsigned_long *)&local_e0);
    }
    else {
      *(pointer *)local_108._M_string_length = local_e0._M_dataplus._M_p;
      local_108._M_string_length = local_108._M_string_length + 8;
    }
    sVar6 = (bufferSTL->super_Buffer).m_Position;
    lVar7 = *(long *)((bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start + sVar6);
    (bufferSTL->super_Buffer).m_Position = sVar6 + 8;
    local_e0._M_dataplus._M_p = (pointer)(lVar7 - absoluteStartPos);
    if (local_108._M_string_length == local_108.field_2._M_allocated_capacity) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108,
                 (iterator)local_108._M_string_length,(unsigned_long *)&local_e0);
    }
    else {
      *(pointer *)local_108._M_string_length = local_e0._M_dataplus._M_p;
      local_108._M_string_length = local_108._M_string_length + 8;
    }
    sVar6 = (bufferSTL->super_Buffer).m_Position;
    local_e0._M_dataplus._M_p =
         *(pointer *)
          ((bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start + sVar6);
    (bufferSTL->super_Buffer).m_Position = sVar6 + 8;
    if (local_108._M_string_length == local_108.field_2._M_allocated_capacity) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_108,
                 (iterator)local_108._M_string_length,(unsigned_long *)&local_e0);
    }
    else {
      *(pointer *)local_108._M_string_length = local_e0._M_dataplus._M_p;
      local_108._M_string_length = local_108._M_string_length + 8;
    }
    this_00 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)(local_c0->_vptr_BP4Deserializer[-3] +
                                 (long)&(this->m_Minifooter).VersionTag),(key_type *)&local_b0);
    this_01 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[](this_00,(key_type *)&local_90);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (this_01,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108);
    psVar1 = &(bufferSTL->super_Buffer).m_Position;
    *psVar1 = *psVar1 + 8;
    if (local_108._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_108._M_dataplus._M_p);
    }
  } while (((char)local_b4 == '\0') &&
          ((bufferSTL->super_Buffer).m_Position <
           (ulong)((long)(bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>.
                        _M_impl.super__Vector_impl_data._M_start)));
  return;
}

Assistant:

void BP4Deserializer::ParseMetadataIndex(BufferSTL &bufferSTL, const size_t absoluteStartPos,
                                         const bool hasHeader, const bool oneStepOnly)
{
    const auto &buffer = bufferSTL.m_Buffer;
    size_t &position = bufferSTL.m_Position;

    if (hasHeader)
    {
        // Read header (64 bytes)
        // long version string
        position = m_VersionTagPosition;
        m_Minifooter.VersionTag.assign(&buffer[position], m_VersionTagLength);

        position = m_EndianFlagPosition;
        const uint8_t endianness = helper::ReadValue<uint8_t>(buffer, position);
        m_Minifooter.IsLittleEndian = (endianness == 0) ? true : false;
#ifndef ADIOS2_HAVE_ENDIAN_REVERSE
        if (helper::IsLittleEndian() != m_Minifooter.IsLittleEndian)
        {
            helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP4Deserializer",
                                              "ParseMetadataIndex",
                                              "reader found BigEndian bp file, "
                                              "this version of ADIOS2 wasn't compiled "
                                              "with the cmake flag -DADIOS2_USE_Endian_Reverse=ON "
                                              "explicitly, in call to Open");
        }
#endif

        // This has no flag in BP4 header. Always true
        m_Minifooter.HasSubFiles = true;

        // Writer's ADIOS version
        position = m_VersionMajorPosition;
        uint8_t ascii = helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
        m_Minifooter.ADIOSVersionMajor = ascii - (uint8_t)'0';
        position = m_VersionMinorPosition;
        ascii = helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
        m_Minifooter.ADIOSVersionMinor = ascii - (uint8_t)'0';
        position = m_VersionPatchPosition;
        ascii = helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
        m_Minifooter.ADIOSVersionPatch = ascii - (uint8_t)'0';
        m_Minifooter.ADIOSVersion = m_Minifooter.ADIOSVersionMajor * 1000000 +
                                    m_Minifooter.ADIOSVersionMinor * 1000 +
                                    m_Minifooter.ADIOSVersionPatch;

        // BP version
        position = m_BPVersionPosition;
        m_Minifooter.Version =
            helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
        if (m_Minifooter.Version != 4)
        {
            helper::Throw<std::runtime_error>(
                "Toolkit", "format::bp::BP4Deserializer", "ParseMetadataIndex",
                "ADIOS2 BP4 Engine only supports bp format "
                "version 4, found " +
                    std::to_string(m_Minifooter.Version) + " version");
        }

        // Writer active flag
        position = m_ActiveFlagPosition;
        const char activeChar =
            helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
        m_WriterIsActive = (activeChar == '\1' ? true : false);

        // move position to first row
        position = 64;
    }

    // Read each record now
    do
    {
        std::vector<uint64_t> ptrs;
        const uint64_t currentStep =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        const uint64_t mpiRank =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        const uint64_t pgIndexStart =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        ptrs.push_back(pgIndexStart - absoluteStartPos);
        const uint64_t variablesIndexStart =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        ptrs.push_back(variablesIndexStart - absoluteStartPos);
        const uint64_t attributesIndexStart =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        ptrs.push_back(attributesIndexStart - absoluteStartPos);
        const uint64_t currentStepEndPos =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        ptrs.push_back(currentStepEndPos - absoluteStartPos);
        const uint64_t currentTimeStamp =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        ptrs.push_back(currentTimeStamp);
        m_MetadataIndexTable[mpiRank][currentStep] = ptrs;
        position += 8;
    } while (!oneStepOnly && position < buffer.size());
}